

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O0

JsErrorCode __thiscall
ChakraHostDeserializerHandle::SetTransferableVars
          (ChakraHostDeserializerHandle *this,JsValueRef *transferableVars,
          size_t transferableVarsCount)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  undefined4 *puVar4;
  HRESULT hr;
  size_t transferableVarsCount_local;
  JsValueRef *transferableVars_local;
  ChakraHostDeserializerHandle *this_local;
  
  if (this->m_deserializer == (Deserializer *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtContextCore.cpp"
                       ,0x134,"(m_deserializer)","m_deserializer");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  HVar3 = Js::SCACore::Deserializer::SetTransferableVars
                    (this->m_deserializer,transferableVars,transferableVarsCount);
  if (HVar3 == 0) {
    this_local._4_4_ = JsNoError;
  }
  else if (HVar3 == -0x7ffbeffd) {
    this_local._4_4_ = JsTransferableNotSupported;
  }
  else if (HVar3 == -0x7ffbeffc) {
    this_local._4_4_ = JsTransferableAlreadyDetached;
  }
  else {
    this_local._4_4_ = JsSerializerNotSupported;
  }
  return this_local._4_4_;
}

Assistant:

JsErrorCode ChakraHostDeserializerHandle::SetTransferableVars(JsValueRef *transferableVars, size_t transferableVarsCount)
{
    Assert(m_deserializer);
    HRESULT hr = m_deserializer->SetTransferableVars((Js::Var *)transferableVars, transferableVarsCount);
    if (hr == S_OK)
    {
        return JsNoError;
    }
    else if (hr == E_SCA_TRANSFERABLE_UNSUPPORTED)
    {
        return JsTransferableNotSupported;
    }
    else if (hr == E_SCA_TRANSFERABLE_NEUTERED)
    {
        return JsTransferableAlreadyDetached;
    }
    return JsSerializerNotSupported;
}